

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testQuatSetRotation.cpp
# Opt level: O0

void anon_unknown.dwarf_7d43e::testRotation(V3f *from,V3f *to)

{
  bool bVar1;
  Quat<float> *in_RSI;
  int __x;
  float extraout_XMM0_Da;
  V3f n0M;
  V3f n0;
  V3f f0;
  V3f fQ0;
  V3f fM0;
  V3f t0;
  V3f fromQ;
  V3f fromM;
  float e;
  M44f M;
  Quatf Q;
  Vec3<float> *in_stack_ffffffffffffff28;
  Vec3<float> *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  float in_stack_ffffffffffffff3c;
  Vec3<float> *in_stack_ffffffffffffff40;
  Vec3<float> *in_stack_ffffffffffffff48;
  undefined1 local_ac [20];
  Quat<float> *in_stack_ffffffffffffff68;
  Quat<float> *in_stack_ffffffffffffff80;
  Vec3<float> *in_stack_ffffffffffffff88;
  Matrix44<float> *in_stack_ffffffffffffffa0;
  Vec3<float> *in_stack_ffffffffffffffa8;
  Vec3<float> *in_stack_ffffffffffffffe0;
  Vec3<float> *in_stack_ffffffffffffffe8;
  
  Imath_2_5::Quat<float>::Quat((Quat<float> *)0x185844);
  Imath_2_5::Quat<float>::setRotation(in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  Imath_2_5::Quat<float>::toMatrix44(in_stack_ffffffffffffff68);
  Imath_2_5::limits<float>::epsilon();
  Imath_2_5::operator*(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  Imath_2_5::operator*(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  Imath_2_5::Vec3<float>::normalized(in_stack_ffffffffffffff48);
  Imath_2_5::Vec3<float>::normalized(in_stack_ffffffffffffff48);
  Imath_2_5::Vec3<float>::normalized(in_stack_ffffffffffffff48);
  bVar1 = Imath_2_5::Vec3<float>::equalWithAbsError
                    (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  if (!bVar1) {
    __assert_fail("t0.equalWithAbsError (fM0, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testQuatSetRotation.cpp"
                  ,0x4a,"void (anonymous namespace)::testRotation(const V3f &, const V3f &)");
  }
  bVar1 = Imath_2_5::Vec3<float>::equalWithAbsError
                    (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  if (bVar1) {
    Imath_2_5::Vec3<float>::normalized(in_stack_ffffffffffffff48);
    __x = (int)local_ac;
    Imath_2_5::Vec3<float>::operator^(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    std::abs(__x);
    if (extraout_XMM0_Da < 0.9) {
      Imath_2_5::Vec3<float>::operator%
                ((Vec3<float> *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                 in_stack_ffffffffffffff30);
      Imath_2_5::Vec3<float>::normalized(in_stack_ffffffffffffff48);
      Imath_2_5::operator*(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
      bVar1 = Imath_2_5::Vec3<float>::equalWithAbsError
                        (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                         in_stack_ffffffffffffff3c);
      if (!bVar1) {
        __assert_fail("n0.equalWithAbsError (n0M, e)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testQuatSetRotation.cpp"
                      ,0x58,"void (anonymous namespace)::testRotation(const V3f &, const V3f &)");
      }
    }
    return;
  }
  __assert_fail("t0.equalWithAbsError (fQ0, e)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testQuatSetRotation.cpp"
                ,0x4b,"void (anonymous namespace)::testRotation(const V3f &, const V3f &)");
}

Assistant:

void
testRotation (const V3f &from, const V3f &to)
{
    //
    // Build a quaternion.
    //

    Quatf Q;
    Q.setRotation (from, to);
    M44f M = Q.toMatrix44();

    //
    // Verify that the quaternion rotates vector from into vector to.
    //

    float e = 20 * limits<float>::epsilon();

    V3f fromM = from * M;
    V3f fromQ = from * Q;
    V3f t0 = to.normalized();
    V3f fM0 = fromM.normalized();
    V3f fQ0 = fromQ.normalized();

    assert (t0.equalWithAbsError (fM0, e));
    assert (t0.equalWithAbsError (fQ0, e));

    //
    // Verify that the rotation axis is the cross product of from and to.
    //

    V3f f0 = from.normalized();

    if (abs (f0 ^ t0) < 0.9)
    {
	V3f n0 = (from % to).normalized();
	V3f n0M = n0 * M;

	assert (n0.equalWithAbsError (n0M, e));
    }
}